

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.cpp
# Opt level: O2

void __thiscall xercesc_4_0::SchemaInfo::~SchemaInfo(SchemaInfo *this)

{
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *pVVar1;
  ValueVectorOf<const_char16_t_*> *this_00;
  RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *this_01;
  ValueVectorOf<xercesc_4_0::DOMNode_*> *this_02;
  XMLCh *p;
  uint i;
  long lVar2;
  
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fCurrentSchemaURL);
  p = this->fTargetNSURIString;
  (*this->fMemoryManager->_vptr_MemoryManager[4])();
  if (this->fImportedInfoList != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
    (*(this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).
      _vptr_BaseRefVectorOf[1])();
  }
  if ((this->fAdoptInclude == true) &&
     (this->fIncludeInfoList != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0)) {
    (*(this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>)._vptr_BaseRefVectorOf
      [1])();
  }
  if (this->fImportingInfoList != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
    (*(this->fImportingInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).
      _vptr_BaseRefVectorOf[1])();
  }
  pVVar1 = this->fFailedRedefineList;
  if (pVVar1 != (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
    ValueVectorOf<const_xercesc_4_0::DOMElement_*>::~ValueVectorOf(pVVar1);
  }
  XMemory::operator_delete((XMemory *)pVVar1,p);
  pVVar1 = this->fRecursingAnonTypes;
  if (pVVar1 != (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
    ValueVectorOf<const_xercesc_4_0::DOMElement_*>::~ValueVectorOf(pVVar1);
  }
  XMemory::operator_delete((XMemory *)pVVar1,p);
  this_00 = this->fRecursingTypeNames;
  if (this_00 != (ValueVectorOf<const_char16_t_*> *)0x0) {
    ValueVectorOf<const_char16_t_*>::~ValueVectorOf(this_00);
  }
  XMemory::operator_delete((XMemory *)this_00,p);
  for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
    this_01 = this->fTopLevelComponents[lVar2];
    if (this_01 != (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0) {
      RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::~RefHashTableOf(this_01);
    }
    XMemory::operator_delete((XMemory *)this_01,p);
  }
  this_02 = this->fNonXSAttList;
  if (this_02 != (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0) {
    ValueVectorOf<xercesc_4_0::DOMNode_*>::~ValueVectorOf(this_02);
  }
  XMemory::operator_delete((XMemory *)this_02,p);
  if (this->fValidationContext != (ValidationContext *)0x0) {
    (*this->fValidationContext->_vptr_ValidationContext[1])();
  }
  if (this->fNamespaceScope != (NamespaceScope *)0x0) {
    (*(this->fNamespaceScope->super_XercesNamespaceResolver)._vptr_XercesNamespaceResolver[2])();
    return;
  }
  return;
}

Assistant:

SchemaInfo::~SchemaInfo()
{
    fMemoryManager->deallocate(fCurrentSchemaURL);//delete [] fCurrentSchemaURL;
	fMemoryManager->deallocate(fTargetNSURIString);
    delete fImportedInfoList;

    if (fAdoptInclude)
        delete fIncludeInfoList;

    delete fImportingInfoList;
    delete fFailedRedefineList;
    delete fRecursingAnonTypes;
    delete fRecursingTypeNames;

    for (unsigned int i = 0; i < C_Count; i++) {
        delete fTopLevelComponents[i];
    }

    delete fNonXSAttList;
    delete fValidationContext;
    delete fNamespaceScope;
}